

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

void lj_tab_clear(GCtab *t)

{
  uint32_t uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  Node *node;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  auVar3 = _DAT_0015d640;
  uVar5 = (ulong)t->asize;
  if (uVar5 != 0) {
    uVar4 = (ulong)(t->array).ptr32;
    lVar7 = uVar5 - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_0015d640;
    auVar10 = _DAT_0015e720;
    auVar11 = _DAT_0015d630;
    do {
      auVar12 = auVar11 ^ auVar3;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        *(undefined4 *)(uVar4 + 4 + uVar6) = 0xffffffff;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        *(undefined4 *)(uVar4 + 0xc + uVar6) = 0xffffffff;
      }
      auVar12 = auVar10 ^ auVar3;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        *(undefined4 *)(uVar4 + 0x14 + uVar6) = 0xffffffff;
        *(undefined4 *)(uVar4 + 0x1c + uVar6) = 0xffffffff;
      }
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar7 + 4;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar7 + 4;
      uVar6 = uVar6 + 0x20;
    } while ((uVar5 * 8 + 0x18 & 0xffffffffffffffe0) != uVar6);
  }
  uVar1 = t->hmask;
  if (uVar1 != 0) {
    uVar2 = (t->node).ptr32;
    uVar5 = (ulong)uVar2;
    *(uint *)(uVar5 + 0x14) = uVar2 + (uVar1 + 1) * 0x18;
    lVar7 = 0;
    do {
      *(undefined8 *)(uVar5 + 0xc + lVar7) = 0xffffffff;
      *(undefined4 *)(uVar5 + 4 + lVar7) = 0xffffffff;
      lVar7 = lVar7 + 0x18;
    } while ((ulong)(uVar1 + 1 + (uint)(uVar1 + 1 == 0)) * 0x18 != lVar7);
  }
  return;
}

Assistant:

static LJ_AINLINE void clearapart(GCtab *t)
{
  uint32_t i, asize = t->asize;
  TValue *array = tvref(t->array);
  for (i = 0; i < asize; i++)
    setnilV(&array[i]);
}